

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# json-validator.cpp
# Opt level: O3

void __thiscall
anon_unknown.dwarf_5714b::numeric<long>::validate
          (numeric<long> *this,json_pointer *ptr,json *instance,json_patch *param_3,error_handler *e
          )

{
  long lVar1;
  long lVar2;
  ulong uVar3;
  double dVar4;
  double dVar5;
  ostringstream oss;
  basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
  local_1e0;
  long local_1d0 [2];
  double local_1c0;
  double local_1b8;
  long local_1a8 [14];
  ios_base local_138 [264];
  
  local_1a8[0] = 0;
  nlohmann::json_abi_v3_11_2::detail::
  get_arithmetic_value<nlohmann::json_abi_v3_11_2::basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>,_long,_0>
            (instance,local_1a8);
  lVar2 = local_1a8[0];
  std::__cxx11::ostringstream::ostringstream((ostringstream *)local_1a8);
  if ((lVar2 != 0) && ((this->multipleOf_).first != false)) {
    local_1c0 = (double)lVar2;
    dVar4 = remainder(local_1c0,(this->multipleOf_).second);
    dVar5 = ABS(local_1c0 / (this->multipleOf_).second);
    uVar3 = -(ulong)(1.0 < dVar5);
    local_1b8 = (double)(~uVar3 & (ulong)dVar4 | (ulong)(dVar4 / dVar5) & uVar3);
    dVar4 = nextafter(local_1c0,0.0);
    if (ABS(dVar4 - local_1c0) < ABS(local_1b8)) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"instance is not a multiple of ",0x1e);
      local_1e0.m_type = null;
      local_1e0.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)7>::
      construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_1e0,(this->multipleOf_).second);
      nlohmann::json_abi_v3_11_2::operator<<((ostream *)local_1a8,&local_1e0);
      nlohmann::json_abi_v3_11_2::
      basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
      ::~basic_json(&local_1e0);
    }
  }
  if ((this->maximum_).first == true) {
    lVar1 = (this->maximum_).second;
    if ((lVar1 <= lVar2 & this->exclusiveMaximum_) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"instance exceeds or equals maximum of ",0x26);
      local_1e0.m_type = null;
      local_1e0.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_1e0,(this->maximum_).second);
      nlohmann::json_abi_v3_11_2::operator<<((ostream *)local_1a8,&local_1e0);
    }
    else {
      if (lVar2 <= lVar1) goto LAB_00123cd2;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"instance exceeds maximum of ",0x1c);
      local_1e0.m_type = null;
      local_1e0.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_1e0,(this->maximum_).second);
      nlohmann::json_abi_v3_11_2::operator<<((ostream *)local_1a8,&local_1e0);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_1e0);
  }
LAB_00123cd2:
  if ((this->minimum_).first == true) {
    lVar1 = (this->minimum_).second;
    if ((lVar2 <= lVar1 & this->exclusiveMinimum_) == 1) {
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"instance is below or equals minimum of ",0x27);
      local_1e0.m_type = null;
      local_1e0.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_1e0,(this->minimum_).second);
      nlohmann::json_abi_v3_11_2::operator<<((ostream *)local_1a8,&local_1e0);
    }
    else {
      if (lVar1 <= lVar2) goto LAB_00123d88;
      std::__ostream_insert<char,std::char_traits<char>>
                ((ostream *)local_1a8,"instance is below minimum of ",0x1d);
      local_1e0.m_type = null;
      local_1e0.m_value.object = (object_t *)0x0;
      nlohmann::json_abi_v3_11_2::detail::
      external_constructor<(nlohmann::json_abi_v3_11_2::detail::value_t)5>::
      construct<nlohmann::json_abi_v3_11_2::basic_json<std::map,std::vector,std::__cxx11::string,bool,long,unsigned_long,double,std::allocator,nlohmann::json_abi_v3_11_2::adl_serializer,std::vector<unsigned_char,std::allocator<unsigned_char>>>>
                (&local_1e0,(this->minimum_).second);
      nlohmann::json_abi_v3_11_2::operator<<((ostream *)local_1a8,&local_1e0);
    }
    nlohmann::json_abi_v3_11_2::
    basic_json<std::map,_std::vector,_std::__cxx11::basic_string<char,_std::char_traits<char>,_std::allocator<char>_>,_bool,_long,_unsigned_long,_double,_std::allocator,_nlohmann::json_abi_v3_11_2::adl_serializer,_std::vector<unsigned_char,_std::allocator<unsigned_char>_>_>
    ::~basic_json(&local_1e0);
  }
LAB_00123d88:
  std::ostream::seekp((long)local_1a8,_S_beg);
  lVar2 = std::ostream::tellp();
  if (lVar2 != 0) {
    std::ostream::seekp((long)local_1a8,_S_beg);
    std::__cxx11::stringbuf::str();
    (*e->_vptr_error_handler[2])(e,ptr,instance,&local_1e0);
    if ((long *)CONCAT71(local_1e0._1_7_,local_1e0.m_type) != local_1d0) {
      operator_delete((long *)CONCAT71(local_1e0._1_7_,local_1e0.m_type),local_1d0[0] + 1);
    }
  }
  std::__cxx11::ostringstream::~ostringstream((ostringstream *)local_1a8);
  std::ios_base::~ios_base(local_138);
  return;
}

Assistant:

void validate(const json::json_pointer &ptr, const json &instance, json_patch &, error_handler &e) const override
	{
		T value = instance; // conversion of json to value_type

		std::ostringstream oss;

		if (multipleOf_.first && value != 0) // zero is multiple of everything
			if (violates_multiple_of(value))
				oss << "instance is not a multiple of " << json(multipleOf_.second);

		if (maximum_.first) {
			if (exclusiveMaximum_ && value >= maximum_.second)
				oss << "instance exceeds or equals maximum of " << json(maximum_.second);
			else if (value > maximum_.second)
				oss << "instance exceeds maximum of " << json(maximum_.second);
		}

		if (minimum_.first) {
			if (exclusiveMinimum_ && value <= minimum_.second)
				oss << "instance is below or equals minimum of " << json(minimum_.second);
			else if (value < minimum_.second)
				oss << "instance is below minimum of " << json(minimum_.second);
		}

		oss.seekp(0, std::ios::end);
		auto size = oss.tellp();
		if (size != 0) {
			oss.seekp(0, std::ios::beg);
			e.error(ptr, instance, oss.str());
		}
	}